

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O3

void aom_highbd_lpf_vertical_4_sse2
               (uint16_t *s,int p,uint8_t *blimit,uint8_t *limit,uint8_t *thresh,int bd)

{
  ulong uVar1;
  undefined8 uVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  short sVar44;
  undefined4 uVar45;
  undefined1 auVar46 [12];
  short sVar47;
  undefined4 uVar48;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [12];
  short sVar66;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  short sVar67;
  undefined1 auVar68 [16];
  short sVar69;
  short sVar73;
  short sVar74;
  short sVar75;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar76 [16];
  ushort uVar77;
  ushort uVar82;
  ushort uVar83;
  ushort uVar84;
  ushort uVar85;
  ushort uVar86;
  ushort uVar87;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  ushort uVar88;
  undefined1 auVar81 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar65 [16];
  short sVar78;
  
  uVar1 = *(ulong *)(s + -2);
  uVar2 = *(undefined8 *)(s + (long)p + -2);
  auVar80._8_4_ = 0;
  auVar80._0_8_ = uVar1;
  auVar80._12_2_ = (short)(uVar1 >> 0x30);
  auVar80._14_2_ = (short)((ulong)uVar2 >> 0x30);
  auVar52._12_4_ = auVar80._12_4_;
  auVar52._8_2_ = 0;
  auVar52._0_8_ = uVar1;
  auVar52._10_2_ = (short)((ulong)uVar2 >> 0x20);
  auVar53._10_6_ = auVar52._10_6_;
  auVar53._8_2_ = (short)(uVar1 >> 0x20);
  auVar53._0_8_ = uVar1;
  auVar33._4_8_ = auVar53._8_8_;
  auVar33._2_2_ = (short)((ulong)uVar2 >> 0x10);
  auVar33._0_2_ = (short)(uVar1 >> 0x10);
  uVar45 = CONCAT22((short)uVar2,(short)uVar1);
  uVar1 = *(ulong *)(s + (long)(p * 2) + -2);
  uVar2 = *(undefined8 *)(s + (long)(p * 3) + -2);
  auVar51._8_4_ = 0;
  auVar51._0_8_ = uVar1;
  auVar51._12_2_ = (short)(uVar1 >> 0x30);
  auVar51._14_2_ = (short)((ulong)uVar2 >> 0x30);
  auVar50._12_4_ = auVar51._12_4_;
  auVar50._8_2_ = 0;
  auVar50._0_8_ = uVar1;
  auVar50._10_2_ = (short)((ulong)uVar2 >> 0x20);
  auVar49._10_6_ = auVar50._10_6_;
  auVar49._8_2_ = (short)(uVar1 >> 0x20);
  auVar49._0_8_ = uVar1;
  auVar34._4_8_ = auVar49._8_8_;
  auVar34._2_2_ = (short)((ulong)uVar2 >> 0x10);
  auVar34._0_2_ = (short)(uVar1 >> 0x10);
  uVar48 = CONCAT22((short)uVar2,(short)uVar1);
  auVar89._4_4_ = uVar48;
  auVar89._0_4_ = uVar45;
  auVar95._0_8_ = CONCAT44(auVar49._8_4_,auVar53._8_4_);
  auVar95._8_4_ = auVar52._12_4_;
  auVar95._12_4_ = auVar50._12_4_;
  auVar70._4_4_ = auVar34._0_4_;
  auVar70._0_4_ = auVar33._0_4_;
  auVar53 = *(undefined1 (*) [16])blimit;
  auVar12[0xd] = 0;
  auVar12._0_13_ = auVar53._0_13_;
  auVar12[0xe] = auVar53[7];
  auVar15[0xc] = auVar53[6];
  auVar15._0_12_ = auVar53._0_12_;
  auVar15._13_2_ = auVar12._13_2_;
  auVar18[0xb] = 0;
  auVar18._0_11_ = auVar53._0_11_;
  auVar18._12_3_ = auVar15._12_3_;
  auVar21[10] = auVar53[5];
  auVar21._0_10_ = auVar53._0_10_;
  auVar21._11_4_ = auVar18._11_4_;
  auVar24[9] = 0;
  auVar24._0_9_ = auVar53._0_9_;
  auVar24._10_5_ = auVar21._10_5_;
  auVar27[8] = auVar53[4];
  auVar27._0_8_ = auVar53._0_8_;
  auVar27._9_6_ = auVar24._9_6_;
  auVar35._7_8_ = 0;
  auVar35._0_7_ = auVar27._8_7_;
  auVar38._1_8_ = SUB158(auVar35 << 0x40,7);
  auVar38[0] = auVar53[3];
  auVar38._9_6_ = 0;
  auVar39._1_10_ = SUB1510(auVar38 << 0x30,5);
  auVar39[0] = auVar53[2];
  auVar39._11_4_ = 0;
  auVar30[2] = auVar53[1];
  auVar30._0_2_ = auVar53._0_2_;
  auVar30._3_12_ = SUB1512(auVar39 << 0x20,3);
  auVar79._0_2_ = auVar53._0_2_ & 0xff;
  auVar79._2_13_ = auVar30._2_13_;
  auVar79[0xf] = 0;
  auVar52 = ZEXT416(bd - 8);
  auVar80 = psllw(auVar79,auVar52);
  auVar53 = *(undefined1 (*) [16])limit;
  auVar13[0xd] = 0;
  auVar13._0_13_ = auVar53._0_13_;
  auVar13[0xe] = auVar53[7];
  auVar16[0xc] = auVar53[6];
  auVar16._0_12_ = auVar53._0_12_;
  auVar16._13_2_ = auVar13._13_2_;
  auVar19[0xb] = 0;
  auVar19._0_11_ = auVar53._0_11_;
  auVar19._12_3_ = auVar16._12_3_;
  auVar22[10] = auVar53[5];
  auVar22._0_10_ = auVar53._0_10_;
  auVar22._11_4_ = auVar19._11_4_;
  auVar25[9] = 0;
  auVar25._0_9_ = auVar53._0_9_;
  auVar25._10_5_ = auVar22._10_5_;
  auVar28[8] = auVar53[4];
  auVar28._0_8_ = auVar53._0_8_;
  auVar28._9_6_ = auVar25._9_6_;
  auVar36._7_8_ = 0;
  auVar36._0_7_ = auVar28._8_7_;
  auVar40._1_8_ = SUB158(auVar36 << 0x40,7);
  auVar40[0] = auVar53[3];
  auVar40._9_6_ = 0;
  auVar41._1_10_ = SUB1510(auVar40 << 0x30,5);
  auVar41[0] = auVar53[2];
  auVar41._11_4_ = 0;
  auVar31[2] = auVar53[1];
  auVar31._0_2_ = auVar53._0_2_;
  auVar31._3_12_ = SUB1512(auVar41 << 0x20,3);
  auVar61._0_2_ = auVar53._0_2_ & 0xff;
  auVar61._2_13_ = auVar31._2_13_;
  auVar61[0xf] = 0;
  auVar62 = psllw(auVar61,auVar52);
  auVar53 = *(undefined1 (*) [16])thresh;
  auVar14[0xd] = 0;
  auVar14._0_13_ = auVar53._0_13_;
  auVar14[0xe] = auVar53[7];
  auVar17[0xc] = auVar53[6];
  auVar17._0_12_ = auVar53._0_12_;
  auVar17._13_2_ = auVar14._13_2_;
  auVar20[0xb] = 0;
  auVar20._0_11_ = auVar53._0_11_;
  auVar20._12_3_ = auVar17._12_3_;
  auVar23[10] = auVar53[5];
  auVar23._0_10_ = auVar53._0_10_;
  auVar23._11_4_ = auVar20._11_4_;
  auVar26[9] = 0;
  auVar26._0_9_ = auVar53._0_9_;
  auVar26._10_5_ = auVar23._10_5_;
  auVar29[8] = auVar53[4];
  auVar29._0_8_ = auVar53._0_8_;
  auVar29._9_6_ = auVar26._9_6_;
  auVar37._7_8_ = 0;
  auVar37._0_7_ = auVar29._8_7_;
  auVar42._1_8_ = SUB158(auVar37 << 0x40,7);
  auVar42[0] = auVar53[3];
  auVar42._9_6_ = 0;
  auVar43._1_10_ = SUB1510(auVar42 << 0x30,5);
  auVar43[0] = auVar53[2];
  auVar43._11_4_ = 0;
  auVar32[2] = auVar53[1];
  auVar32._0_2_ = auVar53._0_2_;
  auVar32._3_12_ = SUB1512(auVar43 << 0x20,3);
  auVar76._0_2_ = auVar53._0_2_ & 0xff;
  auVar76._2_13_ = auVar32._2_13_;
  auVar76[0xf] = 0;
  auVar52 = psllw(auVar76,auVar52);
  auVar53 = ZEXT416((uint)(1 << ((char)bd - 1U & 0x1f)));
  auVar53 = pshuflw(auVar53,auVar53,0);
  auVar54._0_4_ = auVar53._0_4_;
  auVar54._4_4_ = auVar54._0_4_;
  auVar54._8_4_ = auVar54._0_4_;
  auVar54._12_4_ = auVar54._0_4_;
  auVar70._8_8_ = auVar95._0_8_;
  auVar89._8_8_ = auVar95._8_8_;
  auVar59._4_4_ = auVar34._0_4_;
  auVar59._0_4_ = auVar33._0_4_;
  auVar59._8_4_ = uVar45;
  auVar59._12_4_ = uVar48;
  auVar53 = psubusw(auVar59,auVar95);
  auVar92 = psubusw(auVar95,auVar59);
  auVar92 = auVar92 | auVar53;
  auVar53 = paddusw(auVar92,auVar92);
  auVar68._0_8_ = auVar53._0_8_;
  auVar68._8_8_ = 0;
  auVar93._0_2_ = auVar92._8_2_ >> 1;
  auVar93._2_2_ = auVar92._10_2_ >> 1;
  auVar93._4_2_ = auVar92._12_2_ >> 1;
  auVar93._6_2_ = auVar92._14_2_ >> 1;
  auVar93._8_8_ = 0;
  auVar53 = paddusw(auVar93,auVar68);
  auVar53 = auVar53 ^ _DAT_004dd1a0;
  auVar80 = auVar80 ^ _DAT_004dd1a0;
  auVar94._0_2_ = -(ushort)(auVar80._0_2_ < auVar53._0_2_);
  auVar94._2_2_ = -(ushort)(auVar80._2_2_ < auVar53._2_2_);
  auVar94._4_2_ = -(ushort)(auVar80._4_2_ < auVar53._4_2_);
  auVar94._6_2_ = -(ushort)(auVar80._6_2_ < auVar53._6_2_);
  auVar94._8_2_ = -(ushort)(auVar80._8_2_ < auVar53._8_2_);
  auVar94._10_2_ = -(ushort)(auVar80._10_2_ < auVar53._10_2_);
  auVar94._12_2_ = -(ushort)(auVar80._12_2_ < auVar53._12_2_);
  auVar94._14_2_ = -(ushort)(auVar80._14_2_ < auVar53._14_2_);
  auVar53 = paddusw(auVar62,_DAT_004dd1b0);
  auVar53 = auVar53 & auVar94;
  auVar92 = psubusw(auVar70,auVar89);
  auVar80 = psubusw(auVar89,auVar70);
  auVar80 = auVar80 | auVar92;
  sVar73 = auVar80._0_2_;
  sVar69 = auVar80._8_2_;
  auVar71._0_2_ = (ushort)(sVar69 < sVar73) * sVar73 | (ushort)(sVar69 >= sVar73) * sVar69;
  sVar75 = auVar80._2_2_;
  sVar73 = auVar80._10_2_;
  auVar71._2_2_ = (ushort)(sVar73 < sVar75) * sVar75 | (ushort)(sVar73 >= sVar75) * sVar73;
  sVar75 = auVar80._4_2_;
  sVar74 = auVar80._12_2_;
  auVar71._4_2_ = (ushort)(sVar74 < sVar75) * sVar75 | (ushort)(sVar74 >= sVar75) * sVar74;
  sVar78 = auVar80._6_2_;
  sVar75 = auVar80._14_2_;
  auVar71._6_2_ = (ushort)(sVar75 < sVar78) * sVar78 | (ushort)(sVar75 >= sVar78) * sVar75;
  sVar69 = (ushort)(0 < sVar69) * sVar69;
  auVar71._8_2_ = sVar69;
  sVar73 = (ushort)(0 < sVar73) * sVar73;
  auVar71._10_2_ = sVar73;
  sVar74 = (ushort)(0 < sVar74) * sVar74;
  auVar71._12_2_ = sVar74;
  sVar75 = (ushort)(0 < sVar75) * sVar75;
  auVar71._14_2_ = sVar75;
  sVar78 = auVar53._0_2_;
  uVar77 = (sVar78 < (short)auVar71._0_2_) * auVar71._0_2_ |
           (ushort)(sVar78 >= (short)auVar71._0_2_) * sVar78;
  sVar78 = auVar53._2_2_;
  uVar82 = (sVar78 < (short)auVar71._2_2_) * auVar71._2_2_ |
           (ushort)(sVar78 >= (short)auVar71._2_2_) * sVar78;
  sVar78 = auVar53._4_2_;
  uVar83 = (sVar78 < (short)auVar71._4_2_) * auVar71._4_2_ |
           (ushort)(sVar78 >= (short)auVar71._4_2_) * sVar78;
  sVar78 = auVar53._6_2_;
  uVar84 = (sVar78 < (short)auVar71._6_2_) * auVar71._6_2_ |
           (ushort)(sVar78 >= (short)auVar71._6_2_) * sVar78;
  sVar78 = auVar53._8_2_;
  uVar85 = (ushort)(sVar78 < sVar69) * sVar69 | (ushort)(sVar78 >= sVar69) * sVar78;
  sVar69 = auVar53._10_2_;
  uVar86 = (ushort)(sVar69 < sVar73) * sVar73 | (ushort)(sVar69 >= sVar73) * sVar69;
  sVar73 = auVar53._12_2_;
  sVar69 = auVar53._14_2_;
  uVar87 = (ushort)(sVar73 < sVar74) * sVar74 | (ushort)(sVar73 >= sVar74) * sVar73;
  uVar88 = (ushort)(sVar69 < sVar75) * sVar75 | (ushort)(sVar69 >= sVar75) * sVar69;
  auVar71 = auVar71 ^ _DAT_004dd1a0;
  auVar52 = auVar52 ^ _DAT_004dd1a0;
  auVar72._0_4_ =
       CONCAT22(-(ushort)(auVar52._2_2_ < auVar71._2_2_),-(ushort)(auVar52._0_2_ < auVar71._0_2_));
  auVar72._4_4_ =
       (undefined4)
       (CONCAT26(-(ushort)(auVar52._6_2_ < auVar71._6_2_),
                 CONCAT24(-(ushort)(auVar52._4_2_ < auVar71._4_2_),auVar72._0_4_)) >> 0x20);
  auVar72._8_4_ = auVar72._0_4_;
  auVar72._12_4_ = auVar72._4_4_;
  auVar90._0_2_ =
       ((short)uVar85 < (short)uVar77) * uVar77 | ((short)uVar85 >= (short)uVar77) * uVar85;
  auVar90._2_2_ =
       ((short)uVar86 < (short)uVar82) * uVar82 | ((short)uVar86 >= (short)uVar82) * uVar86;
  auVar90._4_2_ =
       ((short)uVar87 < (short)uVar83) * uVar83 | ((short)uVar87 >= (short)uVar83) * uVar87;
  auVar90._6_2_ =
       ((short)uVar88 < (short)uVar84) * uVar84 | ((short)uVar88 >= (short)uVar84) * uVar88;
  auVar90._8_2_ = (0 < (short)uVar85) * uVar85;
  auVar90._10_2_ = (0 < (short)uVar86) * uVar86;
  auVar90._12_2_ = (0 < (short)uVar87) * uVar87;
  auVar90._14_2_ = (0 < (short)uVar88) * uVar88;
  auVar53 = psllw(_DAT_004dd1b0,ZEXT416((uint)bd));
  auVar81._8_4_ = 0xffffffff;
  auVar81._0_8_ = 0xffffffffffffffff;
  auVar81._12_4_ = 0xffffffff;
  auVar53 = paddsw(auVar53,auVar81);
  auVar52 = psubsw(auVar53,auVar54);
  auVar92 = psubsw((undefined1  [16])0x0,auVar54);
  auVar80 = psubsw(auVar59,auVar54);
  auVar53 = psubsw(auVar95,auVar54);
  auVar95 = psubsw(auVar80,auVar53);
  sVar66 = auVar52._0_2_;
  sVar73 = auVar95._0_2_;
  uVar77 = (ushort)(sVar66 < sVar73) * sVar66 | (ushort)(sVar66 >= sVar73) * sVar73;
  sVar67 = auVar52._2_2_;
  sVar73 = auVar95._2_2_;
  uVar82 = (ushort)(sVar67 < sVar73) * sVar67 | (ushort)(sVar67 >= sVar73) * sVar73;
  sVar6 = auVar52._4_2_;
  sVar73 = auVar95._4_2_;
  uVar83 = (ushort)(sVar6 < sVar73) * sVar6 | (ushort)(sVar6 >= sVar73) * sVar73;
  sVar7 = auVar52._6_2_;
  sVar73 = auVar95._6_2_;
  uVar84 = (ushort)(sVar7 < sVar73) * sVar7 | (ushort)(sVar7 >= sVar73) * sVar73;
  sVar8 = auVar52._8_2_;
  sVar73 = auVar95._8_2_;
  uVar85 = (ushort)(sVar8 < sVar73) * sVar8 | (ushort)(sVar8 >= sVar73) * sVar73;
  sVar9 = auVar52._10_2_;
  sVar73 = auVar95._10_2_;
  uVar86 = (ushort)(sVar9 < sVar73) * sVar9 | (ushort)(sVar9 >= sVar73) * sVar73;
  sVar10 = auVar52._12_2_;
  sVar73 = auVar95._12_2_;
  sVar69 = auVar95._14_2_;
  uVar87 = (ushort)(sVar10 < sVar73) * sVar10 | (ushort)(sVar10 >= sVar73) * sVar73;
  sVar11 = auVar52._14_2_;
  uVar88 = (ushort)(sVar11 < sVar69) * sVar11 | (ushort)(sVar11 >= sVar69) * sVar69;
  sVar73 = auVar92._0_2_;
  auVar96._0_2_ = (ushort)((short)uVar77 < sVar73) * sVar73 | ((short)uVar77 >= sVar73) * uVar77;
  sVar69 = auVar92._2_2_;
  auVar96._2_2_ = (ushort)((short)uVar82 < sVar69) * sVar69 | ((short)uVar82 >= sVar69) * uVar82;
  sVar75 = auVar92._4_2_;
  auVar96._4_2_ = (ushort)((short)uVar83 < sVar75) * sVar75 | ((short)uVar83 >= sVar75) * uVar83;
  sVar74 = auVar92._6_2_;
  auVar96._6_2_ = (ushort)((short)uVar84 < sVar74) * sVar74 | ((short)uVar84 >= sVar74) * uVar84;
  sVar78 = auVar92._8_2_;
  auVar96._8_2_ = (ushort)((short)uVar85 < sVar78) * sVar78 | ((short)uVar85 >= sVar78) * uVar85;
  sVar3 = auVar92._10_2_;
  auVar96._10_2_ = (ushort)((short)uVar86 < sVar3) * sVar3 | ((short)uVar86 >= sVar3) * uVar86;
  sVar4 = auVar92._12_2_;
  auVar96._12_2_ = (ushort)((short)uVar87 < sVar4) * sVar4 | ((short)uVar87 >= sVar4) * uVar87;
  sVar5 = auVar92._14_2_;
  auVar96._14_2_ = (ushort)((short)uVar88 < sVar5) * sVar5 | ((short)uVar88 >= sVar5) * uVar88;
  auVar52 = psubsw(auVar96 >> 0x40 & auVar72,auVar96);
  auVar52 = psubsw(auVar52,auVar96);
  auVar52 = psubsw(auVar52,auVar96);
  sVar44 = auVar52._0_2_;
  uVar77 = (ushort)(sVar66 < sVar44) * sVar66 | (ushort)(sVar66 >= sVar44) * sVar44;
  sVar44 = auVar52._2_2_;
  uVar82 = (ushort)(sVar67 < sVar44) * sVar67 | (ushort)(sVar67 >= sVar44) * sVar44;
  sVar44 = auVar52._4_2_;
  uVar83 = (ushort)(sVar6 < sVar44) * sVar6 | (ushort)(sVar6 >= sVar44) * sVar44;
  sVar44 = auVar52._6_2_;
  uVar84 = (ushort)(sVar7 < sVar44) * sVar7 | (ushort)(sVar7 >= sVar44) * sVar44;
  sVar44 = auVar52._8_2_;
  uVar85 = (ushort)(sVar8 < sVar44) * sVar8 | (ushort)(sVar8 >= sVar44) * sVar44;
  sVar44 = auVar52._10_2_;
  uVar86 = (ushort)(sVar9 < sVar44) * sVar9 | (ushort)(sVar9 >= sVar44) * sVar44;
  sVar44 = auVar52._12_2_;
  sVar47 = auVar52._14_2_;
  uVar87 = (ushort)(sVar10 < sVar44) * sVar10 | (ushort)(sVar10 >= sVar44) * sVar44;
  uVar88 = (ushort)(sVar11 < sVar47) * sVar11 | (ushort)(sVar11 >= sVar47) * sVar47;
  auVar97._0_2_ = (ushort)((short)uVar77 < sVar73) * sVar73 | ((short)uVar77 >= sVar73) * uVar77;
  auVar97._2_2_ = (ushort)((short)uVar82 < sVar69) * sVar69 | ((short)uVar82 >= sVar69) * uVar82;
  auVar97._4_2_ = (ushort)((short)uVar83 < sVar75) * sVar75 | ((short)uVar83 >= sVar75) * uVar83;
  auVar97._6_2_ = (ushort)((short)uVar84 < sVar74) * sVar74 | ((short)uVar84 >= sVar74) * uVar84;
  auVar97._8_2_ = (ushort)((short)uVar85 < sVar78) * sVar78 | ((short)uVar85 >= sVar78) * uVar85;
  auVar97._10_2_ = (ushort)((short)uVar86 < sVar3) * sVar3 | ((short)uVar86 >= sVar3) * uVar86;
  auVar97._12_2_ = (ushort)((short)uVar87 < sVar4) * sVar4 | ((short)uVar87 >= sVar4) * uVar87;
  auVar97._14_2_ = (ushort)((short)uVar88 < sVar5) * sVar5 | ((short)uVar88 >= sVar5) * uVar88;
  auVar52 = psubusw(auVar90,auVar62);
  auVar91._0_2_ = -(ushort)(auVar52._0_2_ == 0);
  auVar91._2_2_ = -(ushort)(auVar52._2_2_ == 0);
  auVar91._4_2_ = -(ushort)(auVar52._4_2_ == 0);
  auVar91._6_2_ = -(ushort)(auVar52._6_2_ == 0);
  auVar91._8_2_ = -(ushort)(auVar52._8_2_ == 0);
  auVar91._10_2_ = -(ushort)(auVar52._10_2_ == 0);
  auVar91._12_2_ = -(ushort)(auVar52._12_2_ == 0);
  auVar91._14_2_ = -(ushort)(auVar52._14_2_ == 0);
  auVar91 = auVar91 & auVar97;
  auVar55._0_8_ = auVar91._0_8_;
  auVar55._8_4_ = auVar91._0_4_;
  auVar55._12_4_ = auVar91._4_4_;
  auVar52 = paddsw(auVar55,_DAT_004dd1c0);
  sVar44 = auVar52._0_2_;
  uVar77 = (ushort)(sVar66 < sVar44) * sVar66 | (ushort)(sVar66 >= sVar44) * sVar44;
  sVar44 = auVar52._2_2_;
  uVar82 = (ushort)(sVar67 < sVar44) * sVar67 | (ushort)(sVar67 >= sVar44) * sVar44;
  sVar44 = auVar52._4_2_;
  uVar83 = (ushort)(sVar6 < sVar44) * sVar6 | (ushort)(sVar6 >= sVar44) * sVar44;
  sVar44 = auVar52._6_2_;
  uVar84 = (ushort)(sVar7 < sVar44) * sVar7 | (ushort)(sVar7 >= sVar44) * sVar44;
  sVar44 = auVar52._8_2_;
  uVar85 = (ushort)(sVar8 < sVar44) * sVar8 | (ushort)(sVar8 >= sVar44) * sVar44;
  sVar44 = auVar52._10_2_;
  uVar86 = (ushort)(sVar9 < sVar44) * sVar9 | (ushort)(sVar9 >= sVar44) * sVar44;
  sVar44 = auVar52._12_2_;
  sVar47 = auVar52._14_2_;
  uVar87 = (ushort)(sVar10 < sVar44) * sVar10 | (ushort)(sVar10 >= sVar44) * sVar44;
  uVar88 = (ushort)(sVar11 < sVar47) * sVar11 | (ushort)(sVar11 >= sVar47) * sVar47;
  auVar56._0_2_ = (ushort)((short)uVar77 < sVar73) * sVar73 | ((short)uVar77 >= sVar73) * uVar77;
  auVar56._2_2_ = (ushort)((short)uVar82 < sVar69) * sVar69 | ((short)uVar82 >= sVar69) * uVar82;
  auVar56._4_2_ = (ushort)((short)uVar83 < sVar75) * sVar75 | ((short)uVar83 >= sVar75) * uVar83;
  auVar56._6_2_ = (ushort)((short)uVar84 < sVar74) * sVar74 | ((short)uVar84 >= sVar74) * uVar84;
  auVar56._8_2_ = (ushort)((short)uVar85 < sVar78) * sVar78 | ((short)uVar85 >= sVar78) * uVar85;
  auVar56._10_2_ = (ushort)((short)uVar86 < sVar3) * sVar3 | ((short)uVar86 >= sVar3) * uVar86;
  auVar56._12_2_ = (ushort)((short)uVar87 < sVar4) * sVar4 | ((short)uVar87 >= sVar4) * uVar87;
  auVar56._14_2_ = (ushort)((short)uVar88 < sVar5) * sVar5 | ((short)uVar88 >= sVar5) * uVar88;
  auVar52 = psraw(auVar56,3);
  auVar63._0_2_ = auVar52._0_2_ + 1;
  auVar63._2_2_ = auVar52._2_2_ + 1;
  auVar63._4_2_ = auVar52._4_2_ + 1;
  auVar63._6_2_ = auVar52._6_2_ + 1;
  auVar63._8_2_ = auVar52._0_2_ + 1;
  auVar63._10_2_ = auVar52._2_2_ + 1;
  auVar63._12_2_ = auVar52._4_2_ + 1;
  auVar63._14_2_ = auVar52._6_2_ + 1;
  auVar95 = psraw(auVar63,1);
  auVar64._8_8_ = SUB168(~auVar72 & auVar95,8);
  auVar64._0_8_ = auVar52._8_8_;
  auVar57._8_8_ = SUB168(~auVar72 & auVar95,0);
  auVar57._0_8_ = auVar52._0_8_;
  auVar53 = psubsw(auVar53,auVar57);
  auVar52 = paddsw(auVar64,auVar80);
  sVar44 = auVar53._0_2_;
  uVar77 = (ushort)(sVar66 < sVar44) * sVar66 | (ushort)(sVar66 >= sVar44) * sVar44;
  sVar44 = auVar53._2_2_;
  uVar82 = (ushort)(sVar67 < sVar44) * sVar67 | (ushort)(sVar67 >= sVar44) * sVar44;
  sVar44 = auVar53._4_2_;
  uVar83 = (ushort)(sVar6 < sVar44) * sVar6 | (ushort)(sVar6 >= sVar44) * sVar44;
  sVar44 = auVar53._6_2_;
  uVar84 = (ushort)(sVar7 < sVar44) * sVar7 | (ushort)(sVar7 >= sVar44) * sVar44;
  sVar44 = auVar53._8_2_;
  uVar85 = (ushort)(sVar8 < sVar44) * sVar8 | (ushort)(sVar8 >= sVar44) * sVar44;
  sVar44 = auVar53._10_2_;
  uVar86 = (ushort)(sVar9 < sVar44) * sVar9 | (ushort)(sVar9 >= sVar44) * sVar44;
  sVar44 = auVar53._12_2_;
  sVar47 = auVar53._14_2_;
  uVar87 = (ushort)(sVar10 < sVar44) * sVar10 | (ushort)(sVar10 >= sVar44) * sVar44;
  uVar88 = (ushort)(sVar11 < sVar47) * sVar11 | (ushort)(sVar11 >= sVar47) * sVar47;
  auVar92._0_4_ =
       CONCAT22((ushort)((short)uVar82 < sVar69) * sVar69 | ((short)uVar82 >= sVar69) * uVar82,
                (ushort)((short)uVar77 < sVar73) * sVar73 | ((short)uVar77 >= sVar73) * uVar77);
  auVar46._0_8_ =
       CONCAT26((ushort)((short)uVar84 < sVar74) * sVar74 | ((short)uVar84 >= sVar74) * uVar84,
                CONCAT24((ushort)((short)uVar83 < sVar75) * sVar75 |
                         ((short)uVar83 >= sVar75) * uVar83,auVar92._0_4_));
  auVar46._8_2_ = (ushort)((short)uVar85 < sVar78) * sVar78 | ((short)uVar85 >= sVar78) * uVar85;
  auVar46._10_2_ = (ushort)((short)uVar86 < sVar3) * sVar3 | ((short)uVar86 >= sVar3) * uVar86;
  auVar62._12_2_ = (ushort)((short)uVar87 < sVar4) * sVar4 | ((short)uVar87 >= sVar4) * uVar87;
  auVar62._0_12_ = auVar46;
  auVar62._14_2_ = (ushort)((short)uVar88 < sVar5) * sVar5 | ((short)uVar88 >= sVar5) * uVar88;
  sVar44 = auVar52._0_2_;
  uVar77 = (ushort)(sVar66 < sVar44) * sVar66 | (ushort)(sVar66 >= sVar44) * sVar44;
  sVar66 = auVar52._2_2_;
  uVar82 = (ushort)(sVar67 < sVar66) * sVar67 | (ushort)(sVar67 >= sVar66) * sVar66;
  sVar66 = auVar52._4_2_;
  uVar83 = (ushort)(sVar6 < sVar66) * sVar6 | (ushort)(sVar6 >= sVar66) * sVar66;
  sVar66 = auVar52._6_2_;
  uVar84 = (ushort)(sVar7 < sVar66) * sVar7 | (ushort)(sVar7 >= sVar66) * sVar66;
  sVar66 = auVar52._8_2_;
  uVar85 = (ushort)(sVar8 < sVar66) * sVar8 | (ushort)(sVar8 >= sVar66) * sVar66;
  sVar66 = auVar52._10_2_;
  uVar86 = (ushort)(sVar9 < sVar66) * sVar9 | (ushort)(sVar9 >= sVar66) * sVar66;
  sVar66 = auVar52._12_2_;
  sVar67 = auVar52._14_2_;
  uVar87 = (ushort)(sVar10 < sVar66) * sVar10 | (ushort)(sVar10 >= sVar66) * sVar66;
  uVar88 = (ushort)(sVar11 < sVar67) * sVar11 | (ushort)(sVar11 >= sVar67) * sVar67;
  uVar45 = CONCAT22((ushort)((short)uVar82 < sVar69) * sVar69 | ((short)uVar82 >= sVar69) * uVar82,
                    (ushort)((short)uVar77 < sVar73) * sVar73 | ((short)uVar77 >= sVar73) * uVar77);
  auVar60._0_8_ =
       CONCAT26((ushort)((short)uVar84 < sVar74) * sVar74 | ((short)uVar84 >= sVar74) * uVar84,
                CONCAT24((ushort)((short)uVar83 < sVar75) * sVar75 |
                         ((short)uVar83 >= sVar75) * uVar83,uVar45));
  auVar60._8_2_ = (ushort)((short)uVar85 < sVar78) * sVar78 | ((short)uVar85 >= sVar78) * uVar85;
  auVar60._10_2_ = (ushort)((short)uVar86 < sVar3) * sVar3 | ((short)uVar86 >= sVar3) * uVar86;
  auVar65._12_2_ = (ushort)((short)uVar87 < sVar4) * sVar4 | ((short)uVar87 >= sVar4) * uVar87;
  auVar65._0_12_ = auVar60;
  auVar65._14_2_ = (ushort)((short)uVar88 < sVar5) * sVar5 | ((short)uVar88 >= sVar5) * uVar88;
  auVar58._4_4_ = auVar60._8_4_;
  auVar58._0_4_ = uVar45;
  auVar58._8_4_ = (int)((ulong)auVar60._0_8_ >> 0x20);
  auVar58._12_4_ = auVar65._12_4_;
  auVar53 = pshuflw(auVar58,auVar58,0x72);
  auVar53 = pshufhw(auVar53,auVar53,0x72);
  auVar52 = pshuflw(auVar80,auVar54,0x72);
  auVar52 = pshufhw(auVar52,auVar52,0x72);
  auVar80 = paddsw(auVar52,auVar53);
  auVar92._12_4_ = auVar62._12_4_;
  auVar92._4_4_ = auVar46._8_4_;
  auVar92._8_4_ = (int)((ulong)auVar46._0_8_ >> 0x20);
  auVar53 = pshuflw(auVar92,auVar92,0xd8);
  auVar53 = pshufhw(auVar53,auVar53,0xd8);
  auVar52 = pshuflw(auVar54,auVar54,0xd8);
  auVar52 = pshufhw(auVar52,auVar52,0xd8);
  auVar53 = paddsw(auVar52,auVar53);
  *(ulong *)(s + -2) = CONCAT44(auVar53._0_4_,auVar80._0_4_);
  *(ulong *)(s + (long)p + -2) = CONCAT44(auVar53._4_4_,auVar80._4_4_);
  *(ulong *)(s + (long)(p * 2) + -2) = CONCAT44(auVar53._8_4_,auVar80._8_4_);
  *(ulong *)(s + (long)(p * 3) + -2) = CONCAT44(auVar53._12_4_,auVar80._12_4_);
  return;
}

Assistant:

void aom_highbd_lpf_vertical_4_sse2(uint16_t *s, int p, const uint8_t *blimit,
                                    const uint8_t *limit, const uint8_t *thresh,
                                    int bd) {
  __m128i x0, x1, x2, x3, d0, d1, d2, d3;
  __m128i p1p0, q1q0;
  __m128i p1, q1;

  x0 = _mm_loadl_epi64((__m128i *)(s - 2 + 0 * p));
  x1 = _mm_loadl_epi64((__m128i *)(s - 2 + 1 * p));
  x2 = _mm_loadl_epi64((__m128i *)(s - 2 + 2 * p));
  x3 = _mm_loadl_epi64((__m128i *)(s - 2 + 3 * p));

  highbd_transpose4x8_8x4_low_sse2(&x0, &x1, &x2, &x3, &d0, &d1, &d2, &d3);

  highbd_lpf_internal_4_sse2(&d0, &d1, &d2, &d3, &q1q0, &p1p0, blimit, limit,
                             thresh, bd);

  p1 = _mm_srli_si128(p1p0, 8);
  q1 = _mm_srli_si128(q1q0, 8);

  // transpose from 8x4 to 4x8
  highbd_transpose4x8_8x4_low_sse2(&p1, &p1p0, &q1q0, &q1, &d0, &d1, &d2, &d3);

  _mm_storel_epi64((__m128i *)(s - 2 + 0 * p), d0);
  _mm_storel_epi64((__m128i *)(s - 2 + 1 * p), d1);
  _mm_storel_epi64((__m128i *)(s - 2 + 2 * p), d2);
  _mm_storel_epi64((__m128i *)(s - 2 + 3 * p), d3);
}